

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool string_lower(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_value_t value_02;
  gravity_value_t value_03;
  int iVar2;
  char *__dest;
  gravity_fiber_t *pgVar3;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  gravity_string_t *s;
  char local_2078 [8];
  char _buffer_1 [4096];
  char local_1068 [8];
  char _buffer [4096];
  int32_t index;
  gravity_value_t value;
  int i_1;
  int i;
  char *ret;
  gravity_string_t *main_str;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar1 = (args->field_1).p;
  __dest = (char *)gravity_calloc(vm,1,(ulong)(*(int *)((long)&pgVar1->identifier + 4) + 1));
  if (__dest == (char *)0x0) {
    value_03.field_1.n = 0;
    value_03.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_03,rindex);
    vm_local._7_1_ = false;
  }
  else {
    strcpy(__dest,(char *)pgVar1->objclass);
    if (nargs == 1) {
      for (value.field_1.n._4_4_ = 0;
          (uint)value.field_1.n._4_4_ <= *(uint *)((long)&pgVar1->identifier + 4);
          value.field_1.n._4_4_ = value.field_1.n._4_4_ + 1) {
        iVar2 = tolower((int)__dest[(int)value.field_1.n._4_4_]);
        __dest[(int)value.field_1.n._4_4_] = (char)iVar2;
      }
    }
    else {
      for (value.field_1.n._0_4_ = 1; (int)value.field_1.n._0_4_ < (int)(uint)nargs;
          value.field_1.n._0_4_ = value.field_1.n._0_4_ + 1) {
        if (args[(int)value.field_1.n._0_4_].isa != gravity_class_int) {
          free(__dest);
          snprintf(local_2078,0x1000,"lower() expects either no arguments, or integer arguments.");
          pgVar3 = gravity_vm_fiber(vm);
          gravity_fiber_seterror(pgVar3,local_2078);
          value_01.field_1.n = 0;
          value_01.isa = gravity_class_null;
          gravity_vm_setslot(vm,value_01,rindex);
          return false;
        }
        _buffer._4092_4_ = (undefined4)args[(int)value.field_1.n._0_4_].field_1.n;
        if ((int)_buffer._4092_4_ < 0) {
          _buffer._4092_4_ = *(int *)((long)&pgVar1->identifier + 4) + _buffer._4092_4_;
        }
        if (((int)_buffer._4092_4_ < 0) ||
           (*(uint *)((long)&pgVar1->identifier + 4) <= (uint)_buffer._4092_4_)) {
          free(__dest);
          snprintf(local_1068,0x1000,"Out of bounds error: index %d beyond bounds 0...%d",
                   (ulong)(uint)_buffer._4092_4_,
                   (ulong)(*(int *)((long)&pgVar1->identifier + 4) - 1));
          pgVar3 = gravity_vm_fiber(vm);
          gravity_fiber_seterror(pgVar3,local_1068);
          _buffer_1._4088_8_ = gravity_class_null;
          value_02.field_1.n = 0;
          value_02.isa = gravity_class_null;
          gravity_vm_setslot(vm,value_02,rindex);
          return false;
        }
        iVar2 = tolower((int)__dest[(int)_buffer._4092_4_]);
        __dest[(int)_buffer._4092_4_] = (char)iVar2;
      }
    }
    aVar4.p = (gravity_object_t *)
              gravity_string_new(vm,__dest,*(uint32_t *)((long)&pgVar1->identifier + 4),0);
    value_00.field_1.p = (gravity_object_t *)aVar4.n;
    value_00.isa = (aVar4.p)->isa;
    gravity_vm_setslot(vm,value_00,rindex);
    vm_local._7_1_ = true;
  }
  return vm_local._7_1_;
}

Assistant:

static bool string_lower (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    gravity_string_t *main_str = VALUE_AS_STRING(GET_VALUE(0));

    char *ret = mem_alloc(vm, main_str->len + 1);
    CHECK_MEM_ALLOC(ret);
    strcpy(ret, main_str->s);

    // if no arguments passed, change the whole string to lowercase
    if (nargs == 1) {
        for (int i = 0; i <= main_str->len; ++i) {
         ret[i] = tolower(ret[i]);
        }
    }
    // otherwise, evaluate all the arguments
    else {
        for (int i = 1; i < nargs; ++i) {
            gravity_value_t value = GET_VALUE(i);
            if (VALUE_ISA_INT(value)) {
                int32_t index = (int32_t)VALUE_AS_INT(value);

                if (index < 0) index = main_str->len + index;
                if ((index < 0) || ((uint32_t)index >= main_str->len))  {
                    mem_free(ret);
                    RETURN_ERROR("Out of bounds error: index %d beyond bounds 0...%d", index, main_str->len - 1);
                }

                ret[index] = tolower(ret[index]);
            }
            else {
                mem_free(ret);
                RETURN_ERROR("lower() expects either no arguments, or integer arguments.");
            }
        }
    }

    gravity_string_t *s = gravity_string_new(vm, ret, main_str->len, 0);
    RETURN_VALUE(VALUE_FROM_OBJECT(s), rindex);
}